

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCommand.cpp
# Opt level: O2

bool __thiscall
llbuild::buildsystem::ExternalCommand::isResultValid
          (ExternalCommand *this,BuildSystem *system,BuildValue *value)

{
  pointer ppBVar1;
  pointer ppBVar2;
  BuildNode *this_00;
  bool bVar3;
  bool bVar4;
  FileSystem *fileSystem;
  FileInfo *this_01;
  ulong uVar5;
  FileInfo info;
  FileInfo local_80;
  
  if ((this->alwaysOutOfDate == false) &&
     ((value->kind == SuccessfulCommandWithOutputSignature || (value->kind == SuccessfulCommand))))
  {
    ppBVar1 = (this->super_Command).outputs.
              super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppBVar2 = (this->super_Command).outputs.
              super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    for (uVar5 = 0; ((ulong)((long)ppBVar1 - (long)ppBVar2) >> 3 & 0xffffffff) != uVar5;
        uVar5 = uVar5 + 1) {
      this_00 = (this->super_Command).outputs.
                super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar5];
      if (this_00->type != Virtual) {
        fileSystem = BuildSystem::getFileSystem(system);
        BuildNode::getFileInfo(&local_80,this_00,fileSystem);
        bVar3 = this_00->mutated;
        this_01 = BuildValue::getNthOutputInfo(value,(uint)uVar5);
        if (bVar3 == true) {
          bVar3 = llbuild::basic::FileInfo::isMissing(this_01);
          bVar4 = llbuild::basic::FileInfo::isMissing(&local_80);
          if (bVar3 != bVar4) goto LAB_0018c4dd;
        }
        else {
          bVar3 = llbuild::basic::FileInfo::operator!=(this_01,&local_80);
          if (bVar3) goto LAB_0018c4dd;
        }
      }
    }
    bVar3 = true;
  }
  else {
LAB_0018c4dd:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ExternalCommand::isResultValid(BuildSystem& system,
                                    const BuildValue& value) {
  // Treat the command as always out-of-date, if requested.
  if (alwaysOutOfDate)
    return false;
      
  // If the prior value wasn't for a successful command, recompute.
  if (!value.isSuccessfulCommand())
    return false;
    
  // Check the timestamps on each of the outputs.
  for (unsigned i = 0, e = outputs.size(); i != e; ++i) {
    auto* node = outputs[i];

    // Ignore virtual outputs.
    if (node->isVirtual())
      continue;

    // Rebuild if the output information has changed.
    //
    // We intentionally allow missing outputs here, as long as they haven't
    // changed. This is under the assumption that the commands themselves are
    // behaving correctly when they exit successfully, and that downstream
    // commands would diagnose required missing inputs.
    //
    // FIXME: CONSISTENCY: One consistency issue in this model currently is that
    // if the output was missing, then appears, nothing will remove it; that
    // results in an inconsistent build. What would be nice if we supported
    // per-edge annotations on whether an output was optional -- in that case we
    // could enforce and error on the missing output if not annotated, and we
    // could enable behavior to remove such output files if annotated prior to
    // running the command.
    auto info = node->getFileInfo(system.getFileSystem());

    // If this output is mutated by the build, we can't rely on equivalence,
    // only existence.
    if (node->isMutated()) {
      if (value.getNthOutputInfo(i).isMissing() != info.isMissing())
        return false;
      continue;
    }

    if (value.getNthOutputInfo(i) != info)
      return false;
  }

  // Otherwise, the result is ok.
  return true;
}